

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

vector_t **** gauden_alloc_param_full(uint32 n_cb,uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  uint uVar1;
  ulong uVar2;
  vector_t ****pppppfVar3;
  void *pvVar4;
  size_t d4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong d2;
  
  d2 = (ulong)n_feat;
  if (n_feat == 0) {
    d4 = 0;
    iVar9 = 0;
  }
  else {
    uVar2 = 0;
    iVar9 = 0;
    uVar5 = 0;
    do {
      uVar1 = veclen[uVar2];
      iVar9 = iVar9 + uVar1;
      if (uVar5 < uVar1) {
        uVar5 = uVar1;
      }
      uVar2 = uVar2 + 1;
    } while (d2 != uVar2);
    d4 = (size_t)uVar5;
  }
  pppppfVar3 = (vector_t ****)
               __ckd_calloc_4d__((ulong)n_cb,d2,(ulong)n_density,d4,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                 ,0xf4);
  pvVar4 = __ckd_calloc__((ulong)(iVar9 * iVar9 * n_density * n_cb),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                          ,0xf7);
  if (n_cb != 0) {
    uVar2 = 0;
    uVar5 = 0;
    do {
      if (n_feat != 0) {
        uVar6 = 0;
        do {
          if (n_density != 0) {
            uVar1 = veclen[uVar6];
            uVar7 = 0;
            do {
              if ((ulong)uVar1 != 0) {
                uVar8 = 0;
                do {
                  pppppfVar3[uVar2][uVar6][uVar7][uVar8] =
                       (vector_t)((long)pvVar4 + (ulong)uVar5 * 4);
                  uVar8 = uVar8 + 1;
                  uVar5 = uVar5 + uVar1;
                } while (uVar1 != uVar8);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != n_density);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != d2);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != n_cb);
  }
  return pppppfVar3;
}

Assistant:

vector_t ****
gauden_alloc_param_full(uint32 n_cb,
			uint32 n_feat,
			uint32 n_density,
			const uint32 *veclen)
{
    uint32 blksize, maxveclen;
    vector_t ****param;
    float32 *buf;
    uint32 i, j, k, l, m;

    for (blksize = 0, maxveclen = 0, j = 0; j < n_feat; j++) {
	blksize += veclen[j];
	if (veclen[j] > maxveclen) maxveclen = veclen[j];
    }

    param = (vector_t ****) ckd_calloc_4d(n_cb, n_feat, n_density,
					  maxveclen, sizeof(vector_t));
    
    buf = ckd_calloc(n_cb * n_density * blksize * blksize,
		     sizeof(float32));

    for (i = 0, m = 0; i < n_cb; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		for (l = 0; l < veclen[j]; l++) {
		    param[i][j][k][l] = &buf[m];

		    m += veclen[j];
		}
	    }
	}
    }
    
    return param;
}